

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O2

int INTEGER__compar_value2enum(void *kp,void *am)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*am <= *kp) {
    uVar1 = (uint)(*kp != *am);
  }
  return uVar1;
}

Assistant:

static int
INTEGER__compar_value2enum(const void *kp, const void *am) {
	long a = *(const long *)kp;
	const asn_INTEGER_enum_map_t *el = (const asn_INTEGER_enum_map_t *)am;
	long b = el->nat_value;
	if(a < b) return -1;
	else if(a == b) return 0;
	else return 1;
}